

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hostkey_hash.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  undefined1 local_2040 [8];
  size_t len;
  char *pcStack_2030;
  int type;
  char *sha256_hash;
  char *sha1_hash;
  char *hostkey;
  char buf [8192];
  LIBSSH2_SESSION *session_local;
  
  buf._8184_8_ = session;
  sha1_hash = (char *)libssh2_session_hostkey(session,local_2040,(long)&len + 4);
  if (sha1_hash == (char *)0x0) {
    print_last_session_error("libssh2_session_hostkey");
    return 1;
  }
  if (len._4_4_ == 6) {
    pcStack_2030 = (char *)libssh2_hostkey_hash(buf._8184_8_,3);
    if (pcStack_2030 == (char *)0x0) {
      print_last_session_error("libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
      return 1;
    }
    calculate_digest(pcStack_2030,0x20,(char *)&hostkey,0x2000);
    iVar1 = strcmp((char *)&hostkey,EXPECTED_ED25519_SHA256_HASH_DIGEST);
    if (iVar1 != 0) {
      fprintf(_stderr,"ED25519 SHA256 hash not as expected - digest %s != %s\n",&hostkey,
              EXPECTED_ED25519_SHA256_HASH_DIGEST);
      return 1;
    }
  }
  else if (len._4_4_ == 3) {
    sha256_hash = (char *)libssh2_hostkey_hash(buf._8184_8_,2);
    if (sha256_hash == (char *)0x0) {
      print_last_session_error("libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)");
      return 1;
    }
    calculate_digest(sha256_hash,0x14,(char *)&hostkey,0x2000);
    iVar1 = strcmp((char *)&hostkey,EXPECTED_ECDSA_SHA1_HASH_DIGEST);
    if (iVar1 != 0) {
      fprintf(_stderr,"ECDSA SHA1 hash not as expected - digest %s != %s\n",&hostkey,
              EXPECTED_ECDSA_SHA1_HASH_DIGEST);
      return 1;
    }
    pcStack_2030 = (char *)libssh2_hostkey_hash(buf._8184_8_,3);
    if (pcStack_2030 == (char *)0x0) {
      print_last_session_error("libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
      return 1;
    }
    calculate_digest(pcStack_2030,0x20,(char *)&hostkey,0x2000);
    iVar1 = strcmp((char *)&hostkey,EXPECTED_ECDSA_SHA256_HASH_DIGEST);
    if (iVar1 != 0) {
      fprintf(_stderr,"ECDSA SHA256 hash not as expected - digest %s != %s\n",&hostkey,
              EXPECTED_ECDSA_SHA256_HASH_DIGEST);
      return 1;
    }
  }
  else {
    if (len._4_4_ != 1) {
      fprintf(_stderr,"Unexpected type of hostkey: %i\n",(ulong)len._4_4_);
      return 1;
    }
    sha256_hash = (char *)libssh2_hostkey_hash(buf._8184_8_,2);
    if (sha256_hash == (char *)0x0) {
      print_last_session_error("libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)");
      return 1;
    }
    calculate_digest(sha256_hash,0x14,(char *)&hostkey,0x2000);
    iVar1 = strcmp((char *)&hostkey,EXPECTED_RSA_SHA1_HASH_DIGEST);
    if (iVar1 != 0) {
      fprintf(_stderr,"SHA1 hash not as expected - digest %s != %s\n",&hostkey,
              EXPECTED_RSA_SHA1_HASH_DIGEST);
      return 1;
    }
    pcStack_2030 = (char *)libssh2_hostkey_hash(buf._8184_8_,3);
    if (pcStack_2030 == (char *)0x0) {
      print_last_session_error("libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
      return 1;
    }
    calculate_digest(pcStack_2030,0x20,(char *)&hostkey,0x2000);
    iVar1 = strcmp((char *)&hostkey,EXPECTED_RSA_SHA256_HASH_DIGEST);
    if (iVar1 != 0) {
      fprintf(_stderr,"SHA256 hash not as expected - digest %s != %s\n",&hostkey,
              EXPECTED_RSA_SHA256_HASH_DIGEST);
      return 1;
    }
  }
  return 0;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    char buf[BUFSIZ];

    const char *hostkey;
#if LIBSSH2_MD5
    const char *md5_hash;
#endif
    const char *sha1_hash;
    const char *sha256_hash;
    int type;
    size_t len;

    /* these are the host keys under test, they are currently unused */
    (void)EXPECTED_RSA_HOSTKEY;
    (void)EXPECTED_ECDSA_HOSTKEY;
    (void)EXPECTED_ED25519_HOSTKEY;

    hostkey = libssh2_session_hostkey(session, &len, &type);
    if(!hostkey) {
        print_last_session_error("libssh2_session_hostkey");
        return 1;
    }

    if(type == LIBSSH2_HOSTKEY_TYPE_ED25519) {

        sha256_hash = libssh2_hostkey_hash(session,
                                           LIBSSH2_HOSTKEY_HASH_SHA256);
        if(!sha256_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
            return 1;
        }

        calculate_digest(sha256_hash, SHA256_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ED25519_SHA256_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ED25519 SHA256 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ED25519_SHA256_HASH_DIGEST);
            return 1;
        }
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_ECDSA_256) {

#if LIBSSH2_MD5
        md5_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_MD5);
        if(!md5_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_MD5)");
            return 1;
        }

        calculate_digest(md5_hash, MD5_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ECDSA_MD5_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ECDSA MD5 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ECDSA_MD5_HASH_DIGEST);
            return 1;
        }
#endif

        sha1_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
        if(!sha1_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)");
            return 1;
        }

        calculate_digest(sha1_hash, SHA1_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ECDSA_SHA1_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ECDSA SHA1 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ECDSA_SHA1_HASH_DIGEST);
            return 1;
        }

        sha256_hash = libssh2_hostkey_hash(session,
                                           LIBSSH2_HOSTKEY_HASH_SHA256);
        if(!sha256_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
            return 1;
        }

        calculate_digest(sha256_hash, SHA256_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ECDSA_SHA256_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ECDSA SHA256 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ECDSA_SHA256_HASH_DIGEST);
            return 1;
        }
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_RSA) {

#if LIBSSH2_MD5
        md5_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_MD5);
        if(!md5_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_MD5)");
            return 1;
        }

        calculate_digest(md5_hash, MD5_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_RSA_MD5_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "MD5 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_RSA_MD5_HASH_DIGEST);
            return 1;
        }
#endif

        sha1_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
        if(!sha1_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)");
            return 1;
        }

        calculate_digest(sha1_hash, SHA1_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_RSA_SHA1_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "SHA1 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_RSA_SHA1_HASH_DIGEST);
            return 1;
        }

        sha256_hash = libssh2_hostkey_hash(session,
                                           LIBSSH2_HOSTKEY_HASH_SHA256);
        if(!sha256_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
            return 1;
        }

        calculate_digest(sha256_hash, SHA256_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_RSA_SHA256_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "SHA256 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_RSA_SHA256_HASH_DIGEST);
            return 1;
        }
    }
    else {
        fprintf(stderr, "Unexpected type of hostkey: %i\n", type);
        return 1;
    }

    return 0;
}